

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double exponential_01_pdf(double x)

{
  double dVar1;
  
  if (x < 0.0) {
    return 0.0;
  }
  dVar1 = exp(-x);
  return dVar1;
}

Assistant:

double exponential_01_pdf ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    EXPONENTIAL_01_PDF evaluates the Exponential 01 PDF.
//
//  Discussion:
//
//    PDF(X) = EXP ( - X )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf;

  if ( x < 0.0 )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = exp ( - x );
  }

  return pdf;
}